

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.cc
# Opt level: O0

int __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::GetSuffixSize
          (BasicProblem<mp::BasicProblemParams<int>_> *this,Kind kind)

{
  size_type sVar1;
  size_type sVar2;
  uint in_ESI;
  long in_RDI;
  size_t size;
  int local_18;
  
  switch(in_ESI & 3) {
  default:
    sVar1 = std::
            vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
            ::capacity((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                        *)(in_RDI + 0x168));
    local_18 = (int)sVar1;
    break;
  case 1:
    sVar1 = std::
            vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
            ::capacity((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                        *)(in_RDI + 0x228));
    sVar2 = std::
            vector<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
            ::capacity((vector<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                        *)(in_RDI + 0x298));
    local_18 = (int)sVar1 + (int)sVar2;
    break;
  case 2:
    sVar1 = std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::capacity
                      ((vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_> *)(in_RDI + 0x1f8));
    local_18 = (int)sVar1;
    break;
  case 3:
    local_18 = 1;
  }
  return local_18;
}

Assistant:

int BasicProblem<Alloc>::GetSuffixSize(suf::Kind kind) {
  std::size_t size = 0;
  switch (kind & suf::KIND_MASK) {
  default:
    MP_ASSERT(false, "invalid suffix kind");
    // Fall through.
  case suf::VAR:
    size = vars_.capacity();
    break;
  case suf::CON:
    size = algebraic_cons_.capacity() +
        logical_cons_.capacity();
    break;
  case suf::OBJ:
    size = linear_objs_.capacity();
    break;
  case suf::PROBLEM:
    size = 1;
    break;
  }
  return static_cast<int>(size);
}